

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_CountInv(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *pAVar4;
  AInventory *pAVar5;
  PClassActor *pPVar6;
  char *pcVar7;
  PClassActor *type;
  byte bVar8;
  bool bVar9;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numret < 1) {
    return 0;
  }
  if (ret == (VMReturn *)0x0) {
    __assert_fail("ret != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x143,
                  "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003c64bf;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003c6487:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003c64bf:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x144,
                  "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar4 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar4 == (AActor *)0x0) goto LAB_003c63a3;
    pPVar3 = (pAVar4->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar4->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar9 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar9) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar9 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003c64bf;
    }
  }
  else {
    if (pAVar4 != (AActor *)0x0) goto LAB_003c6487;
LAB_003c63a3:
    pAVar4 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003c64de;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003c6490:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003c64de:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x145,
                  "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003c6404;
    pPVar6 = type;
    if (type != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
      do {
        pPVar6 = (PClassActor *)(pPVar6->super_PClass).ParentClass;
        if (pPVar6 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
      } while (pPVar6 != (PClassActor *)0x0);
      if (pPVar6 == (PClassActor *)0x0) {
        pcVar7 = "itemtype == NULL || itemtype->IsDescendantOf(RUNTIME_CLASS(AInventory))";
        goto LAB_003c64de;
      }
    }
    bVar8 = 0;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003c6490;
LAB_003c6404:
    bVar8 = 1;
    type = (PClassActor *)0x0;
  }
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003c651c;
    }
  }
  else if (param[2].field_0.field_3.Type != '\0') {
    pcVar7 = "(param[paramnum]).Type == REGT_INT";
LAB_003c651c:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x146,
                  "int AF_AActor_CountInv(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar4 = COPY_AAPTR(pAVar4,param[2].field_0.i);
  iVar2 = 0;
  if (((bool)(~bVar8 & pAVar4 != (AActor *)0x0)) &&
     (pAVar5 = AActor::FindInventory(pAVar4,type,false), pAVar5 != (AInventory *)0x0)) {
    iVar2 = pAVar5->Amount;
  }
  if (ret->RegType == '\0') {
    *(int *)ret->Location = iVar2;
    return 1;
  }
  __assert_fail("RegType == REGT_INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                ,0x13f,"void VMReturn::SetInt(int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CountInv)
{
	if (numret > 0)
	{
		assert(ret != NULL);
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_CLASS(itemtype, AInventory);
		PARAM_INT_DEF(pick_pointer);

		self = COPY_AAPTR(self, pick_pointer);
		if (self == NULL || itemtype == NULL)
		{
			ret->SetInt(0);
		}
		else
		{
			AInventory *item = self->FindInventory(itemtype);
			ret->SetInt(item ? item->Amount : 0);
		}
		return 1;
	}
	return 0;
}